

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_aliases.h
# Opt level: O3

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,4ul,unsigned_char,12ul,date::character_t<char>&,date::unsigned_integer_t<unsigned_short,2u,4u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>>&,date::character_t<char>&,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               aliases_t<char,_4UL,_unsigned_char,_12UL> *fmt,character_t<char> *others,
               unsigned_integer_t<unsigned_short,_2U,_4U> *others_1,character_t<char> *others_2,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_3,character_t<char> *others_4,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_5,
               optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>
               *others_6,character_t<char> *others_7,
               cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
               *others_8)

{
  ulong uVar1;
  char cVar2;
  char *pcVar3;
  bool bVar4;
  pair<date::static_string<char,_4UL>,_unsigned_char> *ppVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  array<bool,_12UL> is_match;
  array<const_char_*,_12UL> str_list;
  
  ppVar5 = fmt->aliases->_M_elems;
  lVar6 = 0;
  do {
    str_list._M_elems[lVar6] = (char *)ppVar5;
    is_match._M_elems[lVar6] =
         (((pair<date::static_string<char,_4UL>,_unsigned_char> *)&ppVar5->first)->first).m_length
         != 0;
    lVar6 = lVar6 + 1;
    ppVar5 = ppVar5 + 1;
  } while (lVar6 != 0xc);
  bVar9 = true;
  uVar7 = 0;
  while (end->m_position != pos->m_position) {
    cVar2 = pos->m_cache[pos->m_position];
    lVar8 = 2;
    lVar6 = 0;
    do {
      if (is_match._M_elems[lVar6] == true) {
        pcVar3 = str_list._M_elems[lVar6];
        if (*pcVar3 == cVar2) {
          if (pcVar3[1] == '\0') {
            iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++
                      (pos);
            *fmt->value = (&fmt->aliases->_M_elems[0].first.m_data)[lVar8 * 2]._M_elems[0];
            bVar4 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,date::unsigned_integer_t<unsigned_short,2u,4u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>>&,date::character_t<char>&,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>&>
                              (pos,end,others,others_1,others_2,others_3,others_4,others_5,others_6,
                               others_7,others_8);
            goto LAB_00107f56;
          }
          str_list._M_elems[lVar6] = pcVar3 + 1;
        }
        else {
          is_match._M_elems[lVar6] = false;
        }
      }
      lVar6 = lVar6 + 1;
      lVar8 = lVar8 + 3;
    } while (lVar8 != 0x26);
    uVar1 = uVar7 + 1;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
    bVar9 = uVar7 < 3;
    uVar7 = uVar1;
    if (uVar1 == 4) break;
  }
  bVar4 = false;
LAB_00107f56:
  return (bool)(bVar9 & bVar4);
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, aliases_t<Char, Length, Value, Count>& fmt, Others&&... others)
{
    using char_type = typename iterator_traits<Iterator>::value_type;

    std::array<const Char*, Count> str_list;
    std::array<bool, Count> is_match;
    for (std::size_t k = 0; k < Count; ++k)
    {
        const auto& str = fmt.aliases[k].first;
        str_list[k] = str.c_str();
        is_match[k] = !str.empty();
    }

    for (std::size_t i = 0; i < Length; ++i, ++pos)
    {
        if (pos == end)
            return false;

        const char_type ch = *pos;
        for (std::size_t k = 0; k < Count; ++k)
        {
            if (!is_match[k])
                continue;
            
            const Char* str = str_list[k];
            if (*str != ch)
            {
                is_match[k] = false;
                continue;
            }

            ++str;
            if (*str != Char{ '\0' })
            {
                str_list[k] = str;
                continue;
            }

            ++pos;
            fmt.value = fmt.aliases[k].second;
            return read_impl(pos, end, std::forward<Others>(others)...);
        }
    }

    return false;
}